

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  uint uVar1;
  connectdata *conn;
  char cVar2;
  CURLcode CVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  Curl_HttpReq httpreq;
  char *local_a8;
  Curl_HttpReq local_9c;
  dynbuf req;
  char *request;
  char *te;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  conn = data->conn;
  te = "";
  *done = true;
  if ((((conn->alpn == '\x03') &&
       (CVar3 = CURLE_UNSUPPORTED_PROTOCOL, ((ulong)conn->bits & 0x18) == 0x10)) ||
      (CVar3 = Curl_headers_init(data), CVar3 != CURLE_OK)) ||
     (CVar3 = Curl_http_host(data,conn), CVar3 != CURLE_OK)) goto LAB_001331c3;
  pcVar4 = Curl_checkheaders(data,"User-Agent",10);
  if (pcVar4 != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
  }
  Curl_http_method(data,conn,&request,&httpreq);
  CVar3 = CURLE_OK;
  if ((data->state).up.query == (char *)0x0) {
    pcVar4 = (char *)0x0;
LAB_00133271:
    pcVar5 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pcVar5 = (data->state).up.path;
    }
    CVar3 = Curl_http_output_auth(data,conn,request,httpreq,pcVar5,false);
    (*Curl_cfree)(pcVar4);
    cVar2 = (CVar3 != CURLE_OK) * '\x05';
  }
  else {
    pcVar4 = curl_maprintf("%s?%s",(data->state).up.path);
    if (pcVar4 != (char *)0x0) goto LAB_00133271;
    cVar2 = '\x01';
  }
  if (cVar2 != '\x05') {
    if (cVar2 != '\0') {
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)((data->state).aptr.ref);
    (data->state).aptr.ref = (char *)0x0;
    if (((data->state).referer != (char *)0x0) &&
       (pcVar4 = Curl_checkheaders(data,"Referer",7), pcVar4 == (char *)0x0)) {
      pcVar4 = curl_maprintf("Referer: %s\r\n",(data->state).referer);
      (data->state).aptr.ref = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pcVar4 = Curl_checkheaders(data,"Accept-Encoding",0xf);
    if ((pcVar4 == (char *)0x0) && ((data->set).str[0x21] != (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.accept_encoding);
      (data->state).aptr.accept_encoding = (char *)0x0;
      pcVar4 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[0x21]);
      (data->state).aptr.accept_encoding = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      (*Curl_cfree)((data->state).aptr.accept_encoding);
      (data->state).aptr.accept_encoding = (char *)0x0;
    }
    CVar3 = Curl_transferencode(data);
    if ((CVar3 == CURLE_OK) &&
       (CVar3 = Curl_http_req_set_reader(data,httpreq,&te), CVar3 == CURLE_OK)) {
      local_a8 = Curl_checkheaders(data,"Accept",6);
      CVar3 = Curl_http_range(data,httpreq);
      if (CVar3 == CURLE_OK) {
        local_9c = httpreq;
        local_38 = "1.0";
        if ((((data->state).httpversion != '\n') && (conn->httpversion != '\n')) &&
           (local_38 = "1.1", (data->state).httpwant == '\x01')) {
          local_38 = "1.0";
        }
        Curl_dyn_init(&req,0x100000);
        Curl_dyn_reset(&(data->state).headerb);
        CVar3 = Curl_dyn_addf(&req,"%s ",request);
        if (CVar3 == CURLE_OK) {
          CVar3 = Curl_http_target(data,conn,&req);
        }
        if (CVar3 == CURLE_OK) {
          if ((((ulong)conn->bits & 0x80) == 0) ||
             (pcVar4 = Curl_checkheaders(data,"Alt-Used",8), pcVar4 != (char *)0x0)) {
            pcVar4 = (char *)0x0;
          }
          else {
            pcVar4 = curl_maprintf("Alt-Used: %s:%d\r\n",(conn->conn_to_host).name,
                                   (ulong)(uint)conn->conn_to_port);
            if (pcVar4 == (char *)0x0) {
              Curl_dyn_free(&req);
              return CURLE_OUT_OF_MEMORY;
            }
          }
          pcVar5 = (data->state).aptr.host;
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "";
          }
          pcVar6 = (data->state).aptr.proxyuserpwd;
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "";
          }
          pcVar7 = (data->state).aptr.userpwd;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = "";
          }
          pcVar9 = "";
          if (((data->state).field_0x775 & 1) != 0) {
            pcVar11 = (data->state).aptr.rangeline;
            pcVar9 = "";
            if (pcVar11 != (char *)0x0) {
              pcVar9 = pcVar11;
            }
          }
          pcVar11 = (data->set).str[0x2b];
          local_40 = "";
          if ((pcVar11 != (char *)0x0) && (local_40 = "", *pcVar11 != '\0')) {
            pcVar11 = (data->state).aptr.uagent;
            local_40 = "";
            if (pcVar11 != (char *)0x0) {
              local_40 = pcVar11;
            }
          }
          local_48 = "Accept: */*\r\n";
          if (local_a8 != (char *)0x0) {
            local_48 = "";
          }
          pcVar11 = (data->state).aptr.te;
          if (pcVar11 == (char *)0x0) {
            pcVar11 = "";
          }
          pcVar12 = (data->set).str[0x21];
          local_50 = "";
          if ((pcVar12 != (char *)0x0) && (local_50 = "", *pcVar12 != '\0')) {
            pcVar12 = (data->state).aptr.accept_encoding;
            local_50 = "";
            if (pcVar12 != (char *)0x0) {
              local_50 = pcVar12;
            }
          }
          pcVar12 = "";
          if ((data->state).referer != (char *)0x0) {
            pcVar8 = (data->state).aptr.ref;
            pcVar12 = "";
            if (pcVar8 != (char *)0x0) {
              pcVar12 = pcVar8;
            }
          }
          pcVar8 = "";
          local_a8 = pcVar4;
          if (((ulong)conn->bits & 9) == 1) {
            pcVar4 = Curl_checkheaders(data,"Proxy-Connection",0x10);
            pcVar8 = "";
            if (pcVar4 == (char *)0x0) {
              pcVar4 = Curl_checkProxyheaders(data,conn,"Proxy-Connection",0x10);
              pcVar8 = "";
              if (pcVar4 == (char *)0x0) {
                pcVar8 = "Proxy-Connection: Keep-Alive\r\n";
              }
            }
          }
          pcVar4 = local_a8;
          pcVar10 = "";
          if (local_a8 != (char *)0x0) {
            pcVar10 = local_a8;
          }
          CVar3 = Curl_dyn_addf(&req," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s",local_38,pcVar5,pcVar6,
                                pcVar7,pcVar9,local_40,local_48,pcVar11,local_50,pcVar12,pcVar8,te,
                                pcVar10);
          (*Curl_cfree)((data->state).aptr.userpwd);
          (data->state).aptr.userpwd = (char *)0x0;
          (*Curl_cfree)((data->state).aptr.proxyuserpwd);
          (data->state).aptr.proxyuserpwd = (char *)0x0;
          (*Curl_cfree)(pcVar4);
          if (CVar3 == CURLE_OK) {
            if ((((conn->handler->flags & 1) == 0) && (conn->httpversion < 0x14)) &&
               ((data->state).httpwant == '\x03')) {
              Curl_dyn_free(&req);
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            CVar3 = Curl_http_cookies(data,conn,&req);
            if ((CVar3 == CURLE_OK) && (CVar3 = CURLE_OK, 0x3fffffff < conn->handler->protocol)) {
              CVar3 = Curl_ws_request(data,&req);
            }
            if (CVar3 == CURLE_OK) {
              CVar3 = Curl_add_timecondition(data,&req);
            }
            if (CVar3 == CURLE_OK) {
              CVar3 = Curl_add_custom_headers(data,false,&req);
            }
            if ((CVar3 == CURLE_OK) &&
               (CVar3 = Curl_http_req_complete(data,&req,local_9c), CVar3 == CURLE_OK)) {
              CVar3 = Curl_req_send(data,&req);
            }
            Curl_dyn_free(&req);
            if (((CVar3 == CURLE_OK) && (CVar3 = CURLE_OK, 0x13 < conn->httpversion)) &&
               (uVar1 = *(uint *)&(data->req).field_0xd9, (short)uVar1 < 0)) {
              *(uint *)&(data->req).field_0xd9 = uVar1 & 0xffff7fff;
            }
            goto LAB_001331c3;
          }
        }
        Curl_dyn_free(&req);
      }
    }
  }
LAB_001331c3:
  if (CVar3 == CURLE_TOO_LARGE) {
    Curl_failf(data,"HTTP request too large");
  }
  return CVar3;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  switch(conn->alpn) {
  case CURL_HTTP_VERSION_3:
    DEBUGASSERT(Curl_conn_is_http3(data, conn, FIRSTSOCKET));
    break;
  case CURL_HTTP_VERSION_2:
#ifndef CURL_DISABLE_PROXY
    if(!Curl_conn_is_http2(data, conn, FIRSTSOCKET) &&
       conn->bits.proxy && !conn->bits.tunnel_proxy
      ) {
      result = Curl_http2_switch(data, conn, FIRSTSOCKET);
      if(result)
        goto fail;
    }
    else
#endif
      DEBUGASSERT(Curl_conn_is_http2(data, conn, FIRSTSOCKET));
    break;
  case CURL_HTTP_VERSION_1_1:
    /* continue with HTTP/1.x when explicitly requested */
    break;
  default:
    /* Check if user wants to use HTTP/2 with clear TCP */
    if(Curl_http2_may_switch(data, conn, FIRSTSOCKET)) {
      DEBUGF(infof(data, "HTTP/2 over clean TCP"));
      result = Curl_http2_switch(data, conn, FIRSTSOCKET);
      if(result)
        goto fail;
    }
    break;
  }

  /* Add collecting of headers written to client. For a new connection,
   * we might have done that already, but reuse
   * or multiplex needs it here as well. */
  result = Curl_headers_init(data);
  if(result)
    goto fail;

  result = Curl_http_host(data, conn);
  if(result)
    goto fail;

  result = Curl_http_useragent(data);
  if(result)
    goto fail;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      goto fail;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer"))) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
     data->set.str[STRING_ENCODING]) {
    Curl_safefree(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = Curl_transferencode(data);
  if(result)
    goto fail;
#endif

  result = Curl_http_req_set_reader(data, httpreq, &te);
  if(result)
    goto fail;

  p_accept = Curl_checkheaders(data,
                               STRCONST("Accept")) ? NULL : "Accept: */*\r\n";

  result = Curl_http_range(data, httpreq);
  if(result)
    goto fail;

  httpstring = get_http_string(data, conn);

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = Curl_http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, STRCONST("Alt-Used"))) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host ? data->state.aptr.host : ""),
#ifndef CURL_DISABLE_PROXY
                  data->state.aptr.proxyuserpwd ?
                  data->state.aptr.proxyuserpwd : "",
#else
                  "",
#endif
                  data->state.aptr.userpwd ? data->state.aptr.userpwd : "",
                  (data->state.use_range && data->state.aptr.rangeline) ?
                  data->state.aptr.rangeline : "",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent) ?
                  data->state.aptr.uagent : "",
                  p_accept ? p_accept : "",
                  data->state.aptr.te ? data->state.aptr.te : "",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding) ?
                  data->state.aptr.accept_encoding : "",
                  (data->state.referer && data->state.aptr.ref) ?
                  data->state.aptr.ref : "" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, STRCONST("Proxy-Connection")) &&
                   !Curl_checkProxyheaders(data, conn,
                                           STRCONST("Proxy-Connection"))) ?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid reusing old credentials
   * from reused connections */
  Curl_safefree(data->state.aptr.userpwd);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuserpwd);
#endif
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

  if(!(conn->handler->flags&PROTOPT_SSL) &&
     conn->httpversion < 20 &&
     (data->state.httpwant == CURL_HTTP_VERSION_2)) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it is not done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = Curl_http_cookies(data, conn, &req);
#ifndef CURL_DISABLE_WEBSOCKETS
  if(!result && conn->handler->protocol&(CURLPROTO_WS|CURLPROTO_WSS))
    result = Curl_ws_request(data, &req);
#endif
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, &req);

  if(!result) {
    /* req_send takes ownership of the 'req' memory on success */
    result = Curl_http_req_complete(data, &req, httpreq);
    if(!result)
      result = Curl_req_send(data, &req);
  }
  Curl_dyn_free(&req);
  if(result)
    goto fail;

  if((conn->httpversion >= 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
fail:
  if(CURLE_TOO_LARGE == result)
    failf(data, "HTTP request too large");
  return result;
}